

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qprocess.cpp
# Opt level: O2

void __thiscall QProcess::setUnixProcessParameters(QProcess *this,UnixProcessFlags flagsOnly)

{
  pointer __p;
  _func_int **pp_Var1;
  QObjectData *pQVar2;
  
  pQVar2 = (this->super_QIODevice).super_QObject.d_ptr.d;
  pp_Var1 = pQVar2[8]._vptr_QObjectData;
  if (pp_Var1 == (_func_int **)0x0) {
    pQVar2 = pQVar2 + 8;
    __p = (pointer)operator_new(0x40);
    *(undefined8 *)&(__p->childProcessModifier).super__Function_base._M_functor = 0;
    *(undefined8 *)((long)&(__p->childProcessModifier).super__Function_base._M_functor + 8) = 0;
    (__p->childProcessModifier).super__Function_base._M_manager = (_Manager_type)0x0;
    (__p->childProcessModifier)._M_invoker = (_Invoker_type)0x0;
    (__p->processParameters).flags = (QFlagsStorageHelper<QProcess::UnixProcessFlag,_4>)0x0;
    (__p->processParameters).lowestFileDescriptorToClose = 0;
    (__p->processParameters)._reserved[0] = 0;
    (__p->processParameters)._reserved[1] = 0;
    (__p->processParameters)._reserved[2] = 0;
    (__p->processParameters)._reserved[3] = 0;
    (__p->processParameters)._reserved[4] = 0;
    (__p->processParameters)._reserved[5] = 0;
    std::
    __uniq_ptr_impl<QProcessPrivate::UnixExtras,_std::default_delete<QProcessPrivate::UnixExtras>_>
    ::reset((__uniq_ptr_impl<QProcessPrivate::UnixExtras,_std::default_delete<QProcessPrivate::UnixExtras>_>
             *)pQVar2,__p);
    pp_Var1 = pQVar2->_vptr_QObjectData;
  }
  ((QFlagsStorageHelper<QProcess::UnixProcessFlag,_4> *)(pp_Var1 + 4))->
  super_QFlagsStorage<QProcess::UnixProcessFlag> =
       (QFlagsStorage<QProcess::UnixProcessFlag>)
       flagsOnly.super_QFlagsStorageHelper<QProcess::UnixProcessFlag,_4>.
       super_QFlagsStorage<QProcess::UnixProcessFlag>.i;
  *(undefined8 *)((long)pp_Var1 + 0x24) = 0;
  *(undefined8 *)((long)pp_Var1 + 0x2c) = 0;
  pp_Var1[6] = (_func_int *)0x0;
  pp_Var1[7] = (_func_int *)0x0;
  return;
}

Assistant:

void QProcess::setUnixProcessParameters(UnixProcessFlags flagsOnly)
{
    Q_D(QProcess);
    if (!d->unixExtras)
        d->unixExtras.reset(new QProcessPrivate::UnixExtras);
    d->unixExtras->processParameters = { flagsOnly };
}